

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

EnumOptions * __thiscall google::protobuf::EnumOptions::New(EnumOptions *this,Arena *arena)

{
  EnumOptions *this_00;
  
  this_00 = (EnumOptions *)operator_new(0x70);
  EnumOptions(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::EnumOptions>(arena,this_00);
  }
  return this_00;
}

Assistant:

EnumOptions* EnumOptions::New(::google::protobuf::Arena* arena) const {
  EnumOptions* n = new EnumOptions;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}